

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

bool tinyusdz::is_identity(matrix2d *m)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  
  dVar1 = m->m[0][0];
  if (-1 < (long)dVar1) {
    uVar2 = (long)dVar1 + 0xc010000000000000;
    uVar3 = -uVar2;
    if (0 < (long)uVar2) {
      uVar3 = uVar2;
    }
    if (uVar3 < 2) {
      dVar1 = m->m[0][1];
      if ((long)dVar1 < 0) {
        if (ABS(dVar1) != 0.0) {
          return false;
        }
      }
      else if (1 < (ulong)dVar1) {
        return false;
      }
      dVar1 = m->m[1][0];
      if ((long)dVar1 < 0) {
        if (ABS(dVar1) == 0.0) goto LAB_001995de;
      }
      else if ((ulong)dVar1 < 2) {
LAB_001995de:
        dVar1 = m->m[1][1];
        if (-1 < (long)dVar1) {
          return (ulong)dVar1 < 2;
        }
        return ABS(dVar1) == 0.0;
      }
    }
  }
  return false;
}

Assistant:

bool is_identity(const value::matrix2d &m) {
  return math::almost_equals_by_ulps(m.m[0][0], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][1], 0.0, uint64_t(kIdentityMaxUlps));
}